

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::WriteStream(SymmetricMatrix *matrix_to_write,ostream *output_stream)

{
  SymmetricMatrix *in_RDI;
  int j;
  int i;
  int dim;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  byte in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  Row *this;
  SymmetricMatrix *in_stack_ffffffffffffffa8;
  Row local_40;
  int local_24;
  int local_20;
  int local_1c;
  bool local_1;
  
  local_1c = SymmetricMatrix::GetNumDimension(in_RDI);
  if (local_1c == 0) {
    local_1 = false;
  }
  else {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
        this = &local_40;
        SymmetricMatrix::operator[](in_stack_ffffffffffffffa8,(int)((ulong)this >> 0x20));
        in_stack_ffffffffffffffa8 =
             (SymmetricMatrix *)
             SymmetricMatrix::Row::operator[]
                       (this,CONCAT13(in_stack_ffffffffffffff9f,
                                      CONCAT12(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c))
                       );
        in_stack_ffffffffffffff9f =
             WriteStream<double>((double)CONCAT17(in_stack_ffffffffffffff9f,
                                                  CONCAT16(in_stack_ffffffffffffff9e,
                                                           CONCAT24(in_stack_ffffffffffffff9c,
                                                                    in_stack_ffffffffffffff98))),
                                 (ostream *)0x1075da);
        in_stack_ffffffffffffff9e = in_stack_ffffffffffffff9f ^ 0xff;
        SymmetricMatrix::Row::~Row(&local_40);
        if ((in_stack_ffffffffffffff9e & 1) != 0) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool WriteStream(const sptk::SymmetricMatrix& matrix_to_write,
                 std::ostream* output_stream) {
  const int dim(matrix_to_write.GetNumDimension());
  if (0 == dim) {
    return false;
  }

  for (int i(0); i < dim; ++i) {
    for (int j(0); j < dim; ++j) {
      if (!WriteStream(matrix_to_write[i][j], output_stream)) {
        return false;
      }
    }
  }

  return true;
}